

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

bool __thiscall
Clasp::Asp::LogicProgram::simplifyNormal
          (LogicProgram *this,Head_t ht,AtomSpan *head,LitSpan *body,RuleBuilder *out,SRule *meta)

{
  AtomState *this_00;
  byte *pbVar1;
  size_t sVar2;
  int *piVar3;
  PrgNode PVar4;
  uint uVar5;
  uint32 uVar6;
  PrgAtom *pPVar7;
  Lit_t *pLVar8;
  byte bVar9;
  uint uVar10;
  uint32 size;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  LitSpan LVar17;
  
  Potassco::RuleBuilder::clear(out);
  Potassco::RuleBuilder::startBody(out);
  meta->hash = 0;
  meta->pos = 0;
  meta->bid = 0x40000000;
  sVar2 = body->size;
  if (sVar2 != 0) {
    piVar3 = body->first;
    this_00 = &this->atomState_;
    lVar11 = 0;
    do {
      uVar12 = *(uint *)((long)piVar3 + lVar11);
      uVar5 = -uVar12;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      if (0xfffffff < uVar5) {
        Potassco::fail(0x4b,
                       "bool Clasp::Asp::LogicProgram::simplifyNormal(Head_t, const Potassco::AtomSpan &, const Potassco::LitSpan &, RuleBuilder &, SRule &)"
                       ,0x712,"Potassco::atom(*it) < bodyId","Atom out of bounds",0);
      }
      pPVar7 = resize(this,uVar5);
      PVar4 = (pPVar7->super_PrgHead).super_PrgNode;
      uVar12 = *(uint *)((long)piVar3 + lVar11);
      uVar15 = (uint)((ulong)PVar4 >> 0x1e) & 0x3ffffffc;
      uVar5 = uVar12 >> 0x1e;
      bVar9 = PVar4._7_1_ >> 4 & 3;
      uVar12 = ~uVar12;
      if (bVar9 == 2) {
        uVar10 = 1;
LAB_0013df43:
        if (uVar10 == uVar12 >> 0x1f) {
LAB_0013e082:
          LVar17 = Potassco::RuleBuilder::body(out);
          size = (uint32)LVar17.size;
          meta->bid = 0x40000000;
          bVar16 = false;
          goto LAB_0013e0a0;
        }
        uVar13 = (ulong)(uVar15 >> 2);
        if (uVar15 >> 2 < (this->atomState_).state_.ebo_.size) {
          if (((this_00->state_).ebo_.buf[uVar13] & ((uVar5 & 0xfffffffe) == 0) + 1U) != 0)
          goto LAB_0013e082;
          if (bVar9 == 3) goto LAB_0013df88;
        }
        else if (bVar9 == 3) goto LAB_0013dfaf;
      }
      else {
        if (((PVar4._4_4_ >> 0x1c & 3) != 0) || (((ulong)PVar4 >> 0x3e & 1) != 0)) {
          uVar10 = PVar4._4_4_ >> 0x1e & 1;
          goto LAB_0013df43;
        }
        uVar13 = (ulong)(uVar15 >> 2);
        if (uVar15 >> 2 < (this->atomState_).state_.ebo_.size) {
          if (((this_00->state_).ebo_.buf[uVar13] & ((uVar5 & 0xfffffffe) == 0) + 1U) != 0)
          goto LAB_0013e082;
LAB_0013df88:
          if (((this_00->state_).ebo_.buf[uVar13] & 2U - ((uVar5 & 0xfffffffe) == 0)) != 0)
          goto LAB_0013e029;
        }
LAB_0013dfaf:
        bVar16 = (uVar5 & 2) != 0;
        uVar14 = (ulong)-(Var)uVar13;
        if (!bVar16) {
          uVar14 = uVar13;
        }
        AtomState::set(this_00,(Var)uVar13,bVar16 + '\x01');
        Potassco::RuleBuilder::addGoal(out,(WeightLit_t)(uVar14 | 0x100000000));
        meta->pos = meta->pos - ((int)uVar12 >> 0x1f);
        uVar12 = (uVar15 | uVar5) >> 1;
        uVar12 = uVar12 * 0x8000 + ~uVar12;
        uVar12 = (uVar12 >> 0xb ^ uVar12) * 9;
        uVar12 = (uVar12 >> 5 ^ uVar12) * 0x401;
        meta->hash = meta->hash + (uVar12 >> 0x10 ^ uVar12);
      }
LAB_0013e029:
      lVar11 = lVar11 + 4;
    } while (sVar2 << 2 != lVar11);
  }
  LVar17 = Potassco::RuleBuilder::body(out);
  size = (uint32)LVar17.size;
  uVar6 = findBody(this,meta->hash,(Body_t)0x0,size,-1,(WeightLit_t *)0x0);
  meta->bid = uVar6;
  bVar16 = pushHead(this,ht,head,0,out);
LAB_0013e0a0:
  pLVar8 = Potassco::RuleBuilder::lits_begin(out);
  if (size != 0) {
    lVar11 = 0;
    do {
      uVar12 = pLVar8[lVar11];
      uVar5 = -uVar12;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      if (uVar5 < (this->atomState_).state_.ebo_.size) {
        pbVar1 = (this->atomState_).state_.ebo_.buf + uVar5;
        *pbVar1 = *pbVar1 & 0xe0;
      }
      lVar11 = lVar11 + 1;
    } while (size != (uint32)lVar11);
  }
  return bVar16;
}

Assistant:

bool LogicProgram::simplifyNormal(Head_t ht, const Potassco::AtomSpan& head, const Potassco::LitSpan& body, RuleBuilder& out, SRule& meta) {
	out.clear();
	out.startBody();
	meta = SRule();
	bool ok = true;
	for (Potassco::LitSpan::iterator it = Potassco::begin(body), end = Potassco::end(body); it != end; ++it) {
		POTASSCO_CHECK(Potassco::atom(*it) < bodyId, EOVERFLOW, "Atom out of bounds");
		PrgAtom* a = resize(Potassco::atom(*it));
		Literal  p = Literal(a->id(), *it < 0);// replace any eq atoms
		ValueRep v = litVal(a, !p.sign());
		if (v == value_false || atomState_.inBody(~p)) {
			ok = false;
			break;
		}
		else if (v != value_true  && !atomState_.inBody(p)) {
			atomState_.addToBody(p);
			out.addGoal(toInt(p));
			meta.pos  += !p.sign();
			meta.hash += hashLit(p);
		}
	}
	uint32_t bs = toU32(size(out.body()));
	meta.bid = ok ? findBody(meta.hash, Body_t::Normal, bs) : varMax;
	ok = ok && pushHead(ht, head, 0, out);
	for (const Potassco::Lit_t* it = out.lits_begin(); bs--;) {
		atomState_.clearRule(Potassco::atom(*it++));
	}
	return ok;
}